

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&>
               (string *s,char *fmt,bool *v,bool *args,float *args_1,float *args_2,float *args_3,
               float *args_4)

{
  long lVar1;
  ulong uVar2;
  bool *in_RCX;
  byte *in_RDX;
  string *in_RSI;
  char *pcVar3;
  string *in_RDI;
  float *in_R8;
  float *in_R9;
  float *unaff_retaddr;
  bool *in_stack_00000008;
  bool *in_stack_00000010;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  string *psVar4;
  string *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  float *in_stack_fffffffffffffd98;
  float *in_stack_fffffffffffffda0;
  string local_258 [32];
  undefined8 local_238;
  string local_230 [32];
  stringstream local_210 [8];
  char *in_stack_fffffffffffffdf8;
  undefined1 local_200 [4];
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  LogLevel in_stack_fffffffffffffe14;
  string local_88 [32];
  undefined4 local_68;
  undefined1 local_53;
  byte local_52;
  byte local_51;
  string local_50 [24];
  float *in_stack_ffffffffffffffc8;
  
  copyToFormatString(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  lVar1 = std::__cxx11::string::find((char)local_50,0x2a);
  local_51 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_50,0x73);
  local_52 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_50,100);
  local_53 = lVar1 != -1;
  if ((local_51 & 1) == 0) {
    if ((local_52 & 1) == 0) {
      if ((bool)local_53) {
        psVar4 = local_50;
        uVar2 = std::__cxx11::string::find((char)psVar4,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)psVar4,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd98,(bool *)in_stack_fffffffffffffd90);
        std::__cxx11::string::operator+=(in_RDI,local_88);
        std::__cxx11::string::~string(local_88);
      }
      else if ((local_52 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                   in_stack_fffffffffffffdf8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd98,(bool *)in_stack_fffffffffffffd90);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd88);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_210);
        std::ostream::operator<<(local_200,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_238 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        std::__cxx11::string::operator+=(in_RDI,local_230);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_258);
        std::__cxx11::stringstream::~stringstream(local_210);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,float_const&,float_const&,float_const&,float_const&>
              (in_RSI,(char *)in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,unaff_retaddr);
    local_68 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
               in_stack_00000010,in_stack_00000008,in_R9,(float *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd98,in_stack_fffffffffffffda0);
    local_68 = 1;
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}